

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

void htmlCheckEncoding(htmlParserCtxtPtr ctxt,xmlChar *attvalue)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  
  pxVar1 = xmlStrcasestr(attvalue,"charset");
  if (pxVar1 == (xmlChar *)0x0) {
    pxVar2 = (xmlChar *)0x0;
  }
  else {
    pxVar2 = pxVar1 + 7;
    if (((ulong)pxVar1[7] < 0x21) && ((0x100002600U >> ((ulong)pxVar1[7] & 0x3f) & 1) != 0)) {
      pxVar2 = xmlStrcasestr(attvalue,"=");
    }
  }
  if ((pxVar2 != (xmlChar *)0x0) && (*pxVar2 == '=')) {
    htmlCheckEncodingDirect(ctxt,pxVar2 + 1);
    return;
  }
  return;
}

Assistant:

static void
htmlCheckEncoding(htmlParserCtxtPtr ctxt, const xmlChar *attvalue) {
    const xmlChar *encoding;

    if (!attvalue)
	return;

    encoding = xmlStrcasestr(attvalue, BAD_CAST"charset");
    if (encoding != NULL) {
	encoding += 7;
    }
    /*
     * skip blank
     */
    if (encoding && IS_BLANK_CH(*encoding))
	encoding = xmlStrcasestr(attvalue, BAD_CAST"=");
    if (encoding && *encoding == '=') {
	encoding ++;
	htmlCheckEncodingDirect(ctxt, encoding);
    }
}